

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_cipher_suite_t * find_cipher(ptls_context_t *ctx,uint16_t id)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  
  pppVar2 = ctx->cipher_suites;
  do {
    ppVar1 = *pppVar2;
    if (ppVar1 == (ptls_cipher_suite_t *)0x0) {
      return ppVar1;
    }
    pppVar2 = pppVar2 + 1;
  } while (ppVar1->id != id);
  return ppVar1;
}

Assistant:

static ptls_cipher_suite_t *find_cipher(ptls_context_t *ctx, uint16_t id)
{
    ptls_cipher_suite_t **cs;
    for (cs = ctx->cipher_suites; *cs != NULL; ++cs)
        if ((*cs)->id == id)
            return *cs;
    return NULL;
}